

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_to_n32_unsafe.cc
# Opt level: O0

bool s_to_u32_unsafe(char *s,char *s_end,uint32_t *number)

{
  uint uVar1;
  ulong local_30;
  uint64_t u;
  uint32_t *number_local;
  char *s_end_local;
  char *s_local;
  
  local_30 = 0;
  s_end_local = s;
  while( true ) {
    if (s_end_local == s_end) {
      *number = (uint32_t)local_30;
      return true;
    }
    local_30 = (ulong)((int)*s_end_local - 0x30) + local_30 * 10;
    uVar1 = std::numeric_limits<unsigned_int>::max();
    if (uVar1 <= local_30) break;
    s_end_local = s_end_local + 1;
  }
  return false;
}

Assistant:

bool s_to_u32_unsafe (const char * s, const char * s_end, uint32_t & number)
{
	uint64_t u = 0;
	for (; s != s_end; ++s)
	{
		u *= 10;
		u += static_cast<uint32_t> (*s) - 0x30;
		if (u >= std::numeric_limits<uint32_t>::max())
		{
			return false;
		}
	}
	number = static_cast<uint32_t> (u);
	return true;
}